

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

int lisppathname(char *fullname,char *lispname,int dirp,int versionp)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  char *unaff_R12;
  char *pcVar12;
  char *pcVar13;
  char ver_buf [16];
  char ver [16];
  char namebuf [4096];
  char fbuf [4096];
  
  pcVar9 = ver_buf;
  if ((*fullname == '/') && (fullname[1] == '\0')) {
    lispname[0] = '<';
    lispname[1] = '\0';
  }
  else {
    if (dirp == 0) {
      pcVar5 = lispname;
      unaff_R12 = lispname + -1;
      while( true ) {
        while (cVar1 = *pcVar5, cVar1 == '\'') {
          if (pcVar5[1] == '\0') {
            pcVar5 = pcVar5 + 1;
          }
          else {
            pcVar5 = pcVar5 + 2;
          }
        }
        if (cVar1 == '\0') break;
        pcVar5 = pcVar5 + 1;
        if (cVar1 == '>') {
          unaff_R12 = pcVar5;
        }
      }
      pcVar5 = strrchr(fullname,0x2f);
      pcVar5 = pcVar5 + 1;
    }
    else {
      sVar4 = strlen(fullname);
      pcVar5 = fullname + sVar4;
    }
    namebuf[0] = '<';
    if (fullname[1] == '<') {
      pcVar7 = namebuf + 3;
      namebuf[1] = '\'';
      namebuf[2] = '<';
      pcVar13 = fullname + 2;
    }
    else {
      pcVar13 = fullname + 1;
      pcVar7 = namebuf + 1;
    }
    for (; pcVar13 < pcVar5; pcVar13 = pcVar13 + 1) {
      cVar1 = *pcVar13;
      if (cVar1 == '\'') {
LAB_0012e6e8:
        *pcVar7 = '\'';
        pcVar7[1] = cVar1;
        pcVar7 = pcVar7 + 2;
      }
      else {
        if (cVar1 == '/') {
          *pcVar7 = '>';
        }
        else {
          if ((cVar1 == '>') || (cVar1 == ';')) goto LAB_0012e6e8;
          *pcVar7 = cVar1;
        }
        pcVar7 = pcVar7 + 1;
      }
    }
    if (dirp == 0) {
      uVar3 = 0;
      uVar10 = 1;
      do {
        while( true ) {
          pcVar5 = unaff_R12 + 1;
          pcVar12 = unaff_R12 + 1;
          if (*pcVar5 != '.') break;
          if (pcVar12 != lispname) {
            uVar11 = 0;
            if (*unaff_R12 == '\'') {
              uVar11 = uVar10;
            }
            uVar3 = uVar3 | uVar11;
          }
          uVar10 = uVar10 * 2;
          unaff_R12 = pcVar12;
        }
        unaff_R12 = pcVar12;
      } while (*pcVar5 != '\0');
      uVar10 = 1;
      do {
        cVar1 = *pcVar13;
        if (cVar1 == '\'') {
LAB_0012e780:
          *pcVar7 = '\'';
          pcVar7[1] = *pcVar13;
          pcVar7 = pcVar7 + 2;
        }
        else if (cVar1 == '.') {
          if ((uVar10 & ~uVar3) == 0) {
            *pcVar7 = '\'';
            pcVar7[1] = *pcVar13;
            pcVar7 = pcVar7 + 2;
          }
          else {
            *pcVar7 = '.';
            pcVar7 = pcVar7 + 1;
          }
          uVar10 = uVar10 * 2;
        }
        else {
          if ((cVar1 == ';') || (cVar1 == '>')) goto LAB_0012e780;
          if (cVar1 == '\0') goto LAB_0012e7b1;
          *pcVar7 = cVar1;
          pcVar7 = pcVar7 + 1;
        }
        pcVar13 = pcVar13 + 1;
      } while( true );
    }
    if ((pcVar7[-1] != '>') || (pcVar7[-2] == '\'')) {
      *pcVar7 = '>';
      pcVar7 = pcVar7 + 1;
    }
    *pcVar7 = '\0';
LAB_0012e963:
    strcpy(lispname,namebuf);
  }
  return 1;
LAB_0012e7b1:
  *pcVar7 = '\0';
  strcpy(fbuf,namebuf);
  pcVar5 = fbuf;
  pcVar7 = fbuf;
  do {
    while (pcVar13 = pcVar5, cVar1 = *pcVar13, cVar1 != '\'') {
      if (cVar1 == '\0') {
        if (versionp != 0) {
          separate_version(fbuf,ver,1);
        }
LAB_0012e80f:
        pcVar7 = pcVar7 + 1;
LAB_0012e812:
        cVar1 = *pcVar7;
        bVar2 = true;
LAB_0012e818:
        if ((bVar2) && (cVar1 != '\0')) goto code_r0x0012e821;
        if (bVar2) {
          pcVar7[0] = '.';
          pcVar7[1] = '\0';
        }
        strcpy(namebuf,fbuf);
        if ((versionp == 0) || (ver[0] == '\0')) {
          if (versionp == 0) goto LAB_0012e963;
        }
        else {
          sVar4 = strlen(namebuf);
          (namebuf + sVar4)[0] = '.';
          (namebuf + sVar4)[1] = '~';
          namebuf[sVar4 + 2] = '\0';
          strcat(namebuf,ver);
          sVar4 = strlen(namebuf);
          (namebuf + sVar4)[0] = '~';
          (namebuf + sVar4)[1] = '\0';
        }
        pcVar5 = strchr(namebuf,0x7e);
        if (pcVar5 != (char *)0x0) {
          lVar8 = 1;
          pcVar7 = pcVar5;
          while (pcVar7[lVar8] != '\0') {
            if (pcVar7[lVar8] == '~') {
              pcVar13 = pcVar7 + lVar8;
              lVar8 = 1;
              pcVar5 = pcVar7;
              pcVar7 = pcVar13;
            }
            else {
              lVar8 = lVar8 + 1;
            }
          }
          if ((pcVar5 != pcVar7) && (lVar8 == 1 && pcVar5[-1] == '.')) {
            strncpy(ver_buf,pcVar5 + 1,(size_t)(pcVar7 + ~(ulong)pcVar5));
            ver_buf[(long)(pcVar7 + ~(ulong)pcVar5)] = '\0';
            if (ver_buf[0] == '\0') goto LAB_0012e94d;
            while (pcVar9 = pcVar9 + 1, ver_buf[0] != '\0') {
              if ((byte)(ver_buf[0] - 0x3aU) < 0xf6) goto LAB_0012e94d;
              ver_buf[0] = *pcVar9;
            }
            pcVar5[-1] = ';';
            pcVar5[0] = '\0';
            *pcVar7 = '\0';
            uVar6 = strtoul(pcVar5 + 1,(char **)0x0,10);
            sprintf(ver_buf,"%u",uVar6 & 0xffffffff);
            strcat(namebuf,ver_buf);
            goto LAB_0012e963;
          }
        }
LAB_0012e94d:
        sVar4 = strlen(namebuf);
        (namebuf + sVar4)[0] = ';';
        (namebuf + sVar4)[1] = '1';
        namebuf[sVar4 + 2] = '\0';
        goto LAB_0012e963;
      }
      if (cVar1 == '>') {
        pcVar5 = pcVar13 + 1;
        pcVar7 = pcVar13;
      }
      else {
LAB_0012e7f1:
        pcVar5 = pcVar13 + 1;
      }
    }
    if (pcVar13[1] == '\0') goto LAB_0012e7f1;
    pcVar5 = pcVar13 + 2;
  } while( true );
code_r0x0012e821:
  bVar2 = false;
  if (cVar1 != '.') goto code_r0x0012e828;
  goto LAB_0012e818;
code_r0x0012e828:
  if (cVar1 == '\'') {
    pcVar5 = pcVar7 + 1;
    pcVar13 = pcVar7 + 1;
    pcVar7 = pcVar7 + 2;
    if (*pcVar13 == '\0') {
      pcVar7 = pcVar5;
    }
    goto LAB_0012e812;
  }
  goto LAB_0012e80f;
}

Assistant:

int lisppathname(char *fullname, char *lispname, int dirp, int versionp)
{
  char *cp, *dp, *lnamep, *cnamep;
  char namebuf[MAXPATHLEN], fbuf[MAXPATHLEN], ver[VERSIONLEN];
  int i, mask, extensionp;

  if (strcmp(fullname, DIRSEPSTR) == 0) {
    strcpy(lispname, "<");
    return (1);
  }

#ifdef DOS
  /* Split off the drive, if there is one. */
  if (fullname[1] == DRIVESEP) {
    *lispname++ = *fullname++;
    *lispname++ = *fullname++;
  }
#endif
  
  if (!dirp) {
    /*
     * The characters which are dealt with specially (i.e. are quoted)
     * in the Xerox Lisp file naming convention are all valid in UNIX
     * file name convention.  So the conversion rule is almost
     * straightforward except the "extension" field.  Only glancing
     * the UNIX file name, we cannot determine which period character
     * should be quoted in the result Xerox Lisp file name when more
     * than one period are included in the UNIX file name.  In such
     * case, we have to refer to the Xerox Lisp file name representation
     * which is specified the user.  Thus, at first, extract the
     * name field from the original Lisp file name.
     */
    cp = lispname;
    lnamep = cp - 1;
    while (*cp != '\0') {
      switch (*cp) {
        case '>':
          lnamep = cp + 1;
          cp++;
          break;

        case '\'':
          if (*(cp + 1) != '\0')
            cp += 2;
          else
            cp++;
          break;

        default: cp++; break;
      }
    }
    /* Name field in the UNIX file name representation. */
    cnamep = strrchr(fullname, DIRSEP) + 1;
  } else {
    cnamep = fullname + strlen(fullname);
  }

  /*
   * Conversion rule of file name from UNIX to Xerox Lisp.
   *	UNIX		Lisp
   *	/		<    only if it is used as a root directory
   *			     delimiter.
   *	/		>    if used as a directory delimiter for other
   *			     directories than root directory.
   *	>		'>
   *	;		';
   *	'		''
   *	.		'.   only if it is used as a part of the extension
   *			     field.
   *	others		as if
   */

  cp = fullname + 1;
  dp = namebuf;
  *dp++ = '<';

  if (*cp == '<') {
    /*
     * If the first character of the initial directory is '<',
     * it should be quoted in the result Lisp file name.
     */
    *dp++ = '\'';
    *dp++ = *cp++;
  }

  while (cp < cnamep) {
    switch (*cp) {
      case '>':
      case ';':
#ifndef DOS
      case '\'':
#endif /* DOS */
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

#ifdef DOS
      case '/':
#endif
      case DIRSEP:
        *dp++ = '>';
        cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  if (dirp) {
    if (*(dp - 1) != '>' || *(dp - 2) == '\'') *dp++ = '>';
    *dp = '\0';
    strcpy(lispname, namebuf);
    return (1);
  }

  /*
   * Be careful dealing with the extension field.  If we encounter with the
   * period mark which was quoted in the original Lisp file name, we have
   * to quote it in the result file name.
   * First we count the period mark included in the Lisp file name, and
   * remember the position of the quoted period.  Then when we met the
   * period while we are converting the UNIX file name into Lisp one,
   * examine it if it is a quoted one or not, then if so, we quote it.
   */

  mask = 0;
  i = 1;
  lnamep++;

  while (*lnamep) {
    if (*lnamep == '.') {
      if (lnamep != lispname && *(lnamep - 1) == '\'') mask |= i;
      i <<= 1;
    }
    lnamep++;
  }

  i = 1;
  while (*cp) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
        *dp++ = '/';
        cp++;
        break;
#endif
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      case '.':
        if ((i & mask) == i) {
          /* This period should be quoted. */
          *dp++ = '\'';
          *dp++ = *cp++;
        } else {
          *dp++ = *cp++;
        }
        i <<= 1;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file name
   * or not.  If extension field is not included, we have to add a period
   * to specify empty extension field.
   */
  strcpy(fbuf, namebuf);
  dp = cp = fbuf;
  while (*cp) {
    switch (*cp) {
      case '>':
        dp = cp;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  cp = dp + 1;
  if (versionp) separate_version(fbuf, ver, 1);
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.': extensionp = 1; break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    *cp++ = '.';
    *cp = '\0';
  }
  if (versionp && *ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }

  /*
   * Now, it's time to convert the version field.
   */
  if (!dirp && versionp) UnixVersionToLispVersion(namebuf, 0);

  strcpy(lispname, namebuf);
  return (1);
}